

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O0

int gdGuessBackgroundColorFromCorners(gdImagePtr im,int *color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int local_b0;
  int local_a8;
  int local_a0;
  int local_98;
  uint local_94;
  uint local_8c;
  uint local_84;
  uint local_7c;
  int local_78;
  int local_70;
  int local_68;
  int local_60;
  int local_5c;
  int local_54;
  int local_4c;
  int local_44;
  int a;
  int g;
  int b;
  int r;
  int br;
  int bl;
  int tr;
  int tl;
  int *color_local;
  gdImagePtr im_local;
  
  uVar1 = gdImageGetPixel(im,0,0);
  uVar2 = gdImageGetPixel(im,im->sx + -1,0);
  uVar3 = gdImageGetPixel(im,0,im->sy + -1);
  uVar4 = gdImageGetPixel(im,im->sx + -1,im->sy + -1);
  if ((uVar2 == uVar3) && (uVar2 == uVar4)) {
    *color = uVar2;
    im_local._4_4_ = 3;
  }
  else if ((uVar1 == uVar3) && (uVar1 == uVar4)) {
    *color = uVar1;
    im_local._4_4_ = 3;
  }
  else if ((uVar1 == uVar2) && (uVar1 == uVar4)) {
    *color = uVar1;
    im_local._4_4_ = 3;
  }
  else if ((uVar1 == uVar2) && (uVar1 == uVar3)) {
    *color = uVar1;
    im_local._4_4_ = 3;
  }
  else if (((uVar1 == uVar2) || (uVar1 == uVar3)) || (uVar1 == uVar4)) {
    *color = uVar1;
    im_local._4_4_ = 2;
  }
  else if (uVar2 == uVar3) {
    *color = uVar2;
    im_local._4_4_ = 2;
  }
  else if (uVar4 == uVar3) {
    *color = uVar3;
    im_local._4_4_ = 2;
  }
  else {
    if (im->trueColor == 0) {
      local_44 = im->red[(int)uVar1];
    }
    else {
      local_44 = (int)(uVar1 & 0xff0000) >> 0x10;
    }
    if (im->trueColor == 0) {
      local_4c = im->red[(int)uVar2];
    }
    else {
      local_4c = (int)(uVar2 & 0xff0000) >> 0x10;
    }
    if (im->trueColor == 0) {
      local_54 = im->red[(int)uVar3];
    }
    else {
      local_54 = (int)(uVar3 & 0xff0000) >> 0x10;
    }
    if (im->trueColor == 0) {
      local_5c = im->red[(int)uVar4];
    }
    else {
      local_5c = (int)(uVar4 & 0xff0000) >> 0x10;
    }
    if (im->trueColor == 0) {
      local_60 = im->green[(int)uVar1];
    }
    else {
      local_60 = (int)(uVar1 & 0xff00) >> 8;
    }
    if (im->trueColor == 0) {
      local_68 = im->green[(int)uVar2];
    }
    else {
      local_68 = (int)(uVar2 & 0xff00) >> 8;
    }
    if (im->trueColor == 0) {
      local_70 = im->green[(int)uVar3];
    }
    else {
      local_70 = (int)(uVar3 & 0xff00) >> 8;
    }
    if (im->trueColor == 0) {
      local_78 = im->green[(int)uVar4];
    }
    else {
      local_78 = (int)(uVar4 & 0xff00) >> 8;
    }
    if (im->trueColor == 0) {
      local_7c = im->blue[(int)uVar1];
    }
    else {
      local_7c = uVar1 & 0xff;
    }
    if (im->trueColor == 0) {
      local_84 = im->blue[(int)uVar2];
    }
    else {
      local_84 = uVar2 & 0xff;
    }
    if (im->trueColor == 0) {
      local_8c = im->blue[(int)uVar3];
    }
    else {
      local_8c = uVar3 & 0xff;
    }
    if (im->trueColor == 0) {
      local_94 = im->blue[(int)uVar4];
    }
    else {
      local_94 = uVar4 & 0xff;
    }
    if (im->trueColor == 0) {
      local_98 = im->alpha[(int)uVar1];
    }
    else {
      local_98 = (int)(uVar1 & 0x7f000000) >> 0x18;
    }
    if (im->trueColor == 0) {
      local_a0 = im->alpha[(int)uVar2];
    }
    else {
      local_a0 = (int)(uVar2 & 0x7f000000) >> 0x18;
    }
    if (im->trueColor == 0) {
      local_a8 = im->alpha[(int)uVar3];
    }
    else {
      local_a8 = (int)(uVar3 & 0x7f000000) >> 0x18;
    }
    if (im->trueColor == 0) {
      local_b0 = im->alpha[(int)uVar4];
    }
    else {
      local_b0 = (int)(uVar4 & 0x7f000000) >> 0x18;
    }
    iVar5 = gdImageColorClosestAlpha
                      (im,(int)((float)((local_44 + local_4c + local_54 + local_5c) / 4) + 0.5),
                       (int)((float)((local_60 + local_68 + local_70 + local_78) / 4) + 0.5),
                       (int)((float)((int)(local_7c + local_84 + local_8c + local_94) / 4) + 0.5),
                       (int)((float)((local_98 + local_a0 + local_a8 + local_b0) / 4) + 0.5));
    *color = iVar5;
    im_local._4_4_ = 0;
  }
  return im_local._4_4_;
}

Assistant:

static int gdGuessBackgroundColorFromCorners(gdImagePtr im, int *color)
{
	const int tl = gdImageGetPixel(im, 0, 0);
	const int tr = gdImageGetPixel(im, gdImageSX(im) - 1, 0);
	const int bl = gdImageGetPixel(im, 0, gdImageSY(im) -1);
	const int br = gdImageGetPixel(im, gdImageSX(im) - 1, gdImageSY(im) -1);

	if (tr == bl && tr == br) {
		*color = tr;
		return 3;
	} else if (tl == bl && tl == br) {
		*color = tl;
		return 3;
	} else if (tl == tr &&  tl == br) {
		*color = tl;
		return 3;
	} else if (tl == tr &&  tl == bl) {
		*color = tl;
		return 3;
	} else if (tl == tr  || tl == bl || tl == br) {
		*color = tl;
		return 2;
	} else if (tr == bl) {
		*color = tr;
		return 2;
	} else if (br == bl) {
		*color = bl;
		return 2;
	} else {
		register int r,b,g,a;

		r = (int)(0.5f + (gdImageRed(im, tl) + gdImageRed(im, tr) + gdImageRed(im, bl) + gdImageRed(im, br)) / 4);
		g = (int)(0.5f + (gdImageGreen(im, tl) + gdImageGreen(im, tr) + gdImageGreen(im, bl) + gdImageGreen(im, br)) / 4);
		b = (int)(0.5f + (gdImageBlue(im, tl) + gdImageBlue(im, tr) + gdImageBlue(im, bl) + gdImageBlue(im, br)) / 4);
		a = (int)(0.5f + (gdImageAlpha(im, tl) + gdImageAlpha(im, tr) + gdImageAlpha(im, bl) + gdImageAlpha(im, br)) / 4);
		*color = gdImageColorClosestAlpha(im, r, g, b, a);
		return 0;
	}
}